

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

Response * __thiscall
arbiter::http::Curl::post
          (Response *__return_storage_ptr__,Curl *this,string *path,
          vector<char,_std::allocator<char>_> *data,Headers *headers,Query *query,size_t timeout)

{
  int code;
  __uniq_ptr_data<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>,_true,_true>
  _Var1;
  unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  putData;
  vector<char,_std::allocator<char>_> writeData;
  Headers receivedHeaders;
  string local_50 [32];
  
  ::std::__cxx11::string::string(local_50,(string *)path);
  init(this,(EVP_PKEY_CTX *)local_50);
  ::std::__cxx11::string::~string(local_50);
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  _Var1.
  super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>._M_head_impl =
       (__uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
        )operator_new(0x10);
  *(vector<char,_std::allocator<char>_> **)
   _Var1.
   super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
   ._M_t.
   super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
   .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>._M_head_impl =
       data;
  *(undefined8 *)
   ((long)_Var1.
          super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
          ._M_t.
          super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
          .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>.
          _M_head_impl + 8) = 0;
  writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  writeData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  putData._M_t.
  super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>._M_head_impl =
       (__uniq_ptr_data<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>,_true,_true>
        )(__uniq_ptr_data<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>,_true,_true>
          )_Var1.
           super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
           ._M_t.
           super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
           .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>.
           _M_head_impl;
  curl_easy_setopt(this->m_curl,0x4e2c,anon_unknown_4::putCb);
  curl_easy_setopt(this->m_curl,0x2719,
                   _Var1.
                   super___uniq_ptr_impl<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
                   .super__Head_base<0UL,_arbiter::http::(anonymous_namespace)::PutData_*,_false>.
                   _M_head_impl);
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,&writeData);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,&receivedHeaders);
  curl_easy_setopt(this->m_curl,0x2f,1);
  curl_easy_setopt(this->m_curl,0x75a3,
                   (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start);
  code = perform(this);
  Response::Response(__return_storage_ptr__,code,&writeData,&receivedHeaders);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&receivedHeaders._M_t);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&writeData.super__Vector_base<char,_std::allocator<char>_>);
  ::std::
  unique_ptr<arbiter::http::(anonymous_namespace)::PutData,_std::default_delete<arbiter::http::(anonymous_namespace)::PutData>_>
  ::~unique_ptr(&putData);
  return __return_storage_ptr__;
}

Assistant:

Response Curl::post(
        std::string path,
        const std::vector<char>& data,
        Headers headers,
        Query query,
        const std::size_t timeout)
{
#ifdef ARBITER_CURL
    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    std::unique_ptr<PutData> putData(new PutData(data));
    std::vector<char> writeData;

    // Register callback function and data pointer to create the request.
    curl_easy_setopt(m_curl, CURLOPT_READFUNCTION, putCb);
    curl_easy_setopt(m_curl, CURLOPT_READDATA, putData.get());

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &writeData);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Specify that this is a POST request.
    curl_easy_setopt(m_curl, CURLOPT_POST, 1L);

    // Must use this for binary data, otherwise curl will use strlen(), which
    // will likely be incorrect.
    curl_easy_setopt(
            m_curl,
            CURLOPT_INFILESIZE_LARGE,
            static_cast<curl_off_t>(data.size()));

    // Run the command.
    const int httpCode(perform());
    return Response(httpCode, writeData, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}